

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_partial_sign
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *partial_sig,
              secp256k1_musig_secnonce *secnonce,secp256k1_keypair *keypair,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_musig_session *session)

{
  uchar *puVar1;
  secp256k1_musig_partial_sig *psVar2;
  secp256k1_musig_session *session_00;
  int iVar3;
  long lVar4;
  secp256k1_scalar sVar5;
  secp256k1_keypair *psVar6;
  uchar *p1;
  secp256k1_keypair *psVar7;
  secp256k1_keyagg_cache_internal *cache_i_00;
  secp256k1_fe *a;
  char *pcVar8;
  byte bVar9;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  undefined1 auVar10 [16];
  secp256k1_scalar sk;
  secp256k1_scalar k [2];
  secp256k1_scalar s;
  secp256k1_scalar mu;
  secp256k1_musig_session_internal session_i;
  secp256k1_ge keypair_pk;
  secp256k1_ge pk;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_scalar local_24c;
  secp256k1_scalar local_248;
  secp256k1_scalar local_244;
  secp256k1_musig_partial_sig *local_240;
  secp256k1_musig_session *local_238;
  uint local_230;
  secp256k1_scalar local_22c;
  secp256k1_musig_session_internal local_228;
  secp256k1_ge local_1f8;
  secp256k1_ge local_190;
  secp256k1_keyagg_cache_internal local_128;
  
  local_240 = partial_sig;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_musig_partial_sign_cold_9();
  }
  else if (secnonce != (secp256k1_musig_secnonce *)0x0) {
    lVar4 = 0;
    psVar6 = keypair;
    do {
      psVar7 = (secp256k1_keypair *)((ulong)psVar6 & 0xffffffff);
      bVar9 = secnonce->data[lVar4];
      bVar11 = secp256k1_musig_secnonce_magic[lVar4];
      psVar6 = (secp256k1_keypair *)(ulong)((uint)bVar9 - (uint)bVar11);
      if (bVar9 == bVar11) {
        psVar6 = psVar7;
      }
      iVar3 = (int)psVar6;
      if (bVar9 != bVar11) goto LAB_00112583;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    iVar3 = 0;
LAB_00112583:
    if (iVar3 == 0) {
      bVar9 = 0;
      bVar11 = 0;
      bVar12 = 0;
      bVar13 = 0;
      bVar14 = 0;
      bVar15 = 0;
      bVar16 = 0;
      bVar17 = 0;
      bVar18 = 0;
      bVar19 = 0;
      bVar20 = 0;
      bVar21 = 0;
      bVar22 = 0;
      bVar23 = 0;
      bVar24 = 0;
      bVar25 = 0;
      lVar4 = 4;
      do {
        puVar1 = secnonce->data + lVar4;
        bVar9 = bVar9 | *puVar1;
        bVar11 = bVar11 | puVar1[1];
        bVar12 = bVar12 | puVar1[2];
        bVar13 = bVar13 | puVar1[3];
        bVar14 = bVar14 | puVar1[4];
        bVar15 = bVar15 | puVar1[5];
        bVar16 = bVar16 | puVar1[6];
        bVar17 = bVar17 | puVar1[7];
        bVar18 = bVar18 | puVar1[8];
        bVar19 = bVar19 | puVar1[9];
        bVar20 = bVar20 | puVar1[10];
        bVar21 = bVar21 | puVar1[0xb];
        bVar22 = bVar22 | puVar1[0xc];
        bVar23 = bVar23 | puVar1[0xd];
        bVar24 = bVar24 | puVar1[0xe];
        bVar25 = bVar25 | puVar1[0xf];
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x44);
      auVar10[0] = -(bVar9 == 0);
      auVar10[1] = -(bVar11 == 0);
      auVar10[2] = -(bVar12 == 0);
      auVar10[3] = -(bVar13 == 0);
      auVar10[4] = -(bVar14 == 0);
      auVar10[5] = -(bVar15 == 0);
      auVar10[6] = -(bVar16 == 0);
      auVar10[7] = -(bVar17 == 0);
      auVar10[8] = -(bVar18 == 0);
      auVar10[9] = -(bVar19 == 0);
      auVar10[10] = -(bVar20 == 0);
      auVar10[0xb] = -(bVar21 == 0);
      auVar10[0xc] = -(bVar22 == 0);
      auVar10[0xd] = -(bVar23 == 0);
      auVar10[0xe] = -(bVar24 == 0);
      auVar10[0xf] = -(bVar25 == 0);
      local_128.pk.x.n[1] = (uint64_t)&local_228;
      local_228.fin_nonce_parity = local_228.fin_nonce_parity & 0xffffff00;
      local_128.pk.x.n[0] = 0x4d430001;
      local_128.pk.x.n[2] = 1;
      local_128.pk.x.n[3] = 0;
      local_128.pk.x.n[4] = 0;
      local_128.pk.x.magnitude = 0;
      local_128.pk.x.normalized = 0;
      local_190.x.n[0] = 0;
      local_1f8.x.n[0]._0_4_ =
           (uint)((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
      local_238 = session;
      if (ctx->declassify != 0) {
        secp256k1_musig_partial_sign_cold_1();
      }
      if ((uint)local_1f8.x.n[0] == 0) {
        secp256k1_scalar_set_b32(&local_248,secnonce->data + 4,(int *)0x0);
        secp256k1_scalar_set_b32(&local_244,secnonce->data + 0x24,(int *)0x0);
        local_128.pk.x.n[0] = *(uint64_t *)(secnonce->data + 0x44);
        local_128.pk.x.n[1] = *(uint64_t *)(secnonce->data + 0x4c);
        local_128.pk.x.n[2] = *(uint64_t *)(secnonce->data + 0x54);
        local_128.pk.x.n[3] = *(uint64_t *)(secnonce->data + 0x5c);
        local_128.pk.x.n[4] = *(uint64_t *)(secnonce->data + 100);
        local_128.pk.x._40_8_ = *(undefined8 *)(secnonce->data + 0x6c);
        local_128.pk.y.n[0] = *(uint64_t *)(secnonce->data + 0x74);
        local_128.pk.y.n[1] = *(uint64_t *)(secnonce->data + 0x7c);
        secp256k1_ge_from_storage(&local_190,(secp256k1_ge_storage *)&local_128);
        memset(secnonce,0,0x84);
        session_00 = local_238;
        if (local_240 == (secp256k1_musig_partial_sig *)0x0) {
          secp256k1_musig_partial_sign_cold_7();
          return 0;
        }
        if (keypair == (secp256k1_keypair *)0x0) {
          secp256k1_musig_partial_sign_cold_6();
          return 0;
        }
        if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
          secp256k1_musig_partial_sign_cold_5();
          return 0;
        }
        if (local_238 != (secp256k1_musig_session *)0x0) {
          iVar3 = secp256k1_keypair_load(ctx,&local_24c,&local_1f8,keypair);
          if (iVar3 != 0) {
            iVar3 = secp256k1_fe_equal(&local_190.x,&local_1f8.x);
            if ((iVar3 == 0) || (iVar3 = secp256k1_fe_equal(&local_190.y,&local_1f8.y), iVar3 == 0))
            {
              secp256k1_musig_partial_sign_cold_3();
              return 0;
            }
            cache_i_00 = &local_128;
            iVar3 = secp256k1_keyagg_cache_load(ctx,cache_i_00,keyagg_cache);
            if (iVar3 != 0) {
              a = &local_128.pk.y;
              secp256k1_fe_verify(a);
              if (local_128.pk.y.normalized == 0) {
                secp256k1_musig_partial_sign_cold_2();
                *(undefined4 *)a->n = 0;
                *(undefined4 *)(cache_i_00->pk).x.n = 0;
                *(undefined4 *)((long)(cache_i_00->pk).x.n + 4) = 0;
                return 0;
              }
              if (((uint)local_128.pk.y.n[0] & 1) != local_128.parity_acc) {
                secp256k1_scalar_verify(&local_24c);
                sVar5 = 0xd - local_24c;
                if (local_24c == 0) {
                  sVar5 = 0;
                }
                local_24c = sVar5;
                secp256k1_scalar_verify(&local_24c);
              }
              secp256k1_musig_keyaggcoef_internal
                        (&local_22c,local_128.pks_hash,&local_190,&local_128.second_pk);
              secp256k1_scalar_mul(&local_24c,&local_24c,&local_22c);
              iVar3 = secp256k1_musig_session_load(ctx,&local_228,session_00);
              if (iVar3 != 0) {
                if (local_228.fin_nonce_parity != 0) {
                  secp256k1_scalar_verify(&local_248);
                  sVar5 = 0xd - local_248;
                  if (local_248 == 0) {
                    sVar5 = 0;
                  }
                  local_248 = sVar5;
                  secp256k1_scalar_verify(&local_248);
                  secp256k1_scalar_verify(&local_244);
                  sVar5 = 0xd - local_244;
                  if (local_244 == 0) {
                    sVar5 = 0;
                  }
                  local_244 = sVar5;
                  secp256k1_scalar_verify(&local_244);
                }
                secp256k1_scalar_mul(&local_230,&local_228.challenge,&local_24c);
                secp256k1_scalar_mul(&local_244,&local_228.noncecoef,&local_244);
                secp256k1_scalar_add(&local_248,&local_248,&local_244);
                secp256k1_scalar_add(&local_230,&local_230,&local_248);
                psVar2 = local_240;
                psVar2->data[0] = 0xeb;
                psVar2->data[1] = 0xfb;
                psVar2->data[2] = '\x1a';
                psVar2->data[3] = '2';
                secp256k1_scalar_verify(&local_230);
                psVar2->data[0x14] = '\0';
                psVar2->data[0x15] = '\0';
                psVar2->data[0x16] = '\0';
                psVar2->data[0x17] = '\0';
                psVar2->data[0x18] = '\0';
                psVar2->data[0x19] = '\0';
                psVar2->data[0x1a] = '\0';
                psVar2->data[0x1b] = '\0';
                psVar2->data[0x1c] = '\0';
                psVar2->data[0x1d] = '\0';
                psVar2->data[0x1e] = '\0';
                psVar2->data[0x1f] = '\0';
                psVar2->data[0x20] = '\0';
                psVar2->data[0x21] = '\0';
                psVar2->data[0x22] = '\0';
                psVar2->data[0x23] = '\0';
                psVar2->data[4] = '\0';
                psVar2->data[5] = '\0';
                psVar2->data[6] = '\0';
                psVar2->data[7] = '\0';
                psVar2->data[8] = '\0';
                psVar2->data[9] = '\0';
                psVar2->data[10] = '\0';
                psVar2->data[0xb] = '\0';
                psVar2->data[0xc] = '\0';
                psVar2->data[0xd] = '\0';
                psVar2->data[0xe] = '\0';
                psVar2->data[0xf] = '\0';
                psVar2->data[0x10] = '\0';
                psVar2->data[0x11] = '\0';
                psVar2->data[0x12] = '\0';
                psVar2->data[0x13] = '\0';
                *(uint *)(psVar2->data + 0x20) =
                     local_230 >> 0x18 | (local_230 & 0xff0000) >> 8 | (local_230 & 0xff00) << 8 |
                     local_230 << 0x18;
                secp256k1_musig_partial_sign_clear(&local_24c,&local_248);
                return 1;
              }
            }
          }
          secp256k1_musig_partial_sign_clear(&local_24c,&local_248);
          return 0;
        }
        secp256k1_musig_partial_sign_cold_4();
        return 0;
      }
      pcVar8 = "!is_zero";
    }
    else {
      pcVar8 = "secp256k1_memcmp_var(&secnonce->data[0], secp256k1_musig_secnonce_magic, 4) == 0";
    }
    (*(ctx->illegal_callback).fn)(pcVar8,(ctx->illegal_callback).data);
    memset(secnonce,0,0x84);
    secp256k1_musig_partial_sign_clear(&local_24c,&local_248);
    return 0;
  }
  secp256k1_musig_partial_sign_cold_8();
  return 0;
}

Assistant:

int secp256k1_musig_partial_sign(const secp256k1_context* ctx, secp256k1_musig_partial_sig *partial_sig, secp256k1_musig_secnonce *secnonce, const secp256k1_keypair *keypair, const secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_musig_session *session) {
    secp256k1_scalar sk;
    secp256k1_ge pk, keypair_pk;
    secp256k1_scalar k[2];
    secp256k1_scalar mu, s;
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_musig_session_internal session_i;
    int ret;

    VERIFY_CHECK(ctx != NULL);

    ARG_CHECK(secnonce != NULL);
    /* Fails if the magic doesn't match */
    ret = secp256k1_musig_secnonce_load(ctx, k, &pk, secnonce);
    /* Set nonce to zero to avoid nonce reuse. This will cause subsequent calls
     * of this function to fail */
    memset(secnonce, 0, sizeof(*secnonce));
    if (!ret) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    ARG_CHECK(partial_sig != NULL);
    ARG_CHECK(keypair != NULL);
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(session != NULL);

    if (!secp256k1_keypair_load(ctx, &sk, &keypair_pk, keypair)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }
    ARG_CHECK(secp256k1_fe_equal(&pk.x, &keypair_pk.x)
              && secp256k1_fe_equal(&pk.y, &keypair_pk.y));
    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    /* Negate sk if secp256k1_fe_is_odd(&cache_i.pk.y)) XOR cache_i.parity_acc.
     * This corresponds to the line "Let d = g⋅gacc⋅d' mod n" in the
     * specification. */
    if ((secp256k1_fe_is_odd(&cache_i.pk.y)
         != cache_i.parity_acc)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    /* Multiply KeyAgg coefficient */
    secp256k1_musig_keyaggcoef(&mu, &cache_i, &pk);
    secp256k1_scalar_mul(&sk, &sk, &mu);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    if (session_i.fin_nonce_parity) {
        secp256k1_scalar_negate(&k[0], &k[0]);
        secp256k1_scalar_negate(&k[1], &k[1]);
    }

    /* Sign */
    secp256k1_scalar_mul(&s, &session_i.challenge, &sk);
    secp256k1_scalar_mul(&k[1], &session_i.noncecoef, &k[1]);
    secp256k1_scalar_add(&k[0], &k[0], &k[1]);
    secp256k1_scalar_add(&s, &s, &k[0]);
    secp256k1_musig_partial_sig_save(partial_sig, &s);
    secp256k1_musig_partial_sign_clear(&sk, k);
    return 1;
}